

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_timeout.cc
# Opt level: O0

time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
 __thiscall
absl::lts_20250127::synchronization_internal::KernelTimeout::ToChronoTimePoint(KernelTimeout *this)

{
  bool bVar1;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_38;
  int64_t local_30;
  duration<long,_std::ratio<1L,_1000000000L>_> local_28;
  duration<long,_std::ratio<1L,_1000000L>_> local_20;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_> micros;
  KernelTimeout *this_local;
  
  micros.__r = (rep)this;
  bVar1 = has_timeout(this);
  if (bVar1) {
    local_30 = MakeAbsNanos(this);
    std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,void>
              ((duration<long,std::ratio<1l,1000000000l>> *)&local_28,&local_30);
    local_20.__r = (rep)std::chrono::
                        duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                                  (&local_28);
    local_38.__d.__r = (duration)std::chrono::_V2::system_clock::from_time_t(0);
    this_local = (KernelTimeout *)std::chrono::operator+(&local_38,&local_20);
  }
  else {
    this_local = (KernelTimeout *)
                 std::chrono::
                 time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                 ::max();
  }
  return (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
          )(duration)this_local;
}

Assistant:

std::chrono::time_point<std::chrono::system_clock>
KernelTimeout::ToChronoTimePoint() const {
  if (!has_timeout()) {
    return std::chrono::time_point<std::chrono::system_clock>::max();
  }

  // The cast to std::microseconds is because (on some platforms) the
  // std::ratio used by std::chrono::steady_clock doesn't convert to
  // std::nanoseconds, so it doesn't compile.
  auto micros = std::chrono::duration_cast<std::chrono::microseconds>(
      std::chrono::nanoseconds(MakeAbsNanos()));
  return std::chrono::system_clock::from_time_t(0) + micros;
}